

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

ON_GradientColorData *
ON_GradientColorData::FromObject(ON_Object *obj,bool createAndAttachIfMissing)

{
  bool bVar1;
  ON_GradientColorData *pOVar2;
  ON_GradientColorData *pOVar3;
  ON_UUID local_30;
  
  if (obj != (ON_Object *)0x0) {
    local_30 = ON_ClassId::Uuid(&m_ON_GradientColorData_class_rtti);
    pOVar2 = (ON_GradientColorData *)ON_Object::GetUserData(obj,&local_30);
    if (pOVar2 == (ON_GradientColorData *)0x0) {
      pOVar3 = (ON_GradientColorData *)0x0;
    }
    else {
      bVar1 = ON_Object::IsKindOf((ON_Object *)pOVar2,&m_ON_GradientColorData_class_rtti);
      pOVar3 = (ON_GradientColorData *)0x0;
      if (bVar1) {
        pOVar3 = pOVar2;
      }
    }
    if (!createAndAttachIfMissing || pOVar3 != (ON_GradientColorData *)0x0) {
      return pOVar3;
    }
    pOVar2 = (ON_GradientColorData *)operator_new(0x120);
    ON_GradientColorData(pOVar2);
    bVar1 = ON_Object::AttachUserData(obj,(ON_UserData *)pOVar2);
    if (bVar1) {
      return pOVar2;
    }
    (*(pOVar2->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar2);
  }
  return (ON_GradientColorData *)0x0;
}

Assistant:

ON_GradientColorData* ON_GradientColorData::FromObject(ON_Object* obj, bool createAndAttachIfMissing)
{
  if (nullptr == obj)
    return nullptr;
  ON_GradientColorData* rc = ON_GradientColorData::Cast(obj->GetUserData(ON_CLASS_ID(ON_GradientColorData)));
  if (nullptr == rc && createAndAttachIfMissing)
  {
    rc = new ON_GradientColorData();
    if (!obj->AttachUserData(rc))
    {
      delete rc;
      return nullptr;
    }
  }
  return rc;
}